

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::initialize
          (basic_csv_parser<char,_std::allocator<char>_> *this)

{
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *this_00;
  iterator iVar1;
  csv_mode in_EAX;
  csv_mode cVar2;
  undefined8 local_18;
  
  this_00 = &this->stack_;
  local_18._0_4_ = in_EAX;
  std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::reserve(this_00,3)
  ;
  local_18 = (ulong)(csv_mode)local_18;
  iVar1._M_current =
       (this->stack_).
       super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
    _M_realloc_insert<jsoncons::csv::csv_mode>(this_00,iVar1,(csv_mode *)((long)&local_18 + 4));
  }
  else {
    *iVar1._M_current = initial;
    (this->stack_).
    super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  cVar2 = (this->header_lines_ == 0) + header;
  local_18 = CONCAT44(local_18._4_4_,cVar2);
  iVar1._M_current =
       (this->stack_).
       super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
    _M_realloc_insert<jsoncons::csv::csv_mode>(this_00,iVar1,(csv_mode *)&local_18);
  }
  else {
    *iVar1._M_current = cVar2;
    (this->stack_).
    super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void initialize()
    {
        stack_.reserve(default_depth);
        stack_.push_back(csv_mode::initial);
        stack_.push_back((header_lines_ > 0) ? csv_mode::header : csv_mode::data);
    }